

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

logical pnga_update_ghost_dir(Integer g_a,Integer pdim,Integer pdir,logical pflag)

{
  long lVar1;
  Integer *pIVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char **ppcVar6;
  C_Integer *pCVar7;
  char *pcVar8;
  int iVar9;
  ushort uVar10;
  Integer proc;
  logical lVar11;
  Integer *map;
  ulong *proclist;
  long lVar12;
  Integer IVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  C_Integer CVar25;
  size_t sVar26;
  long lVar27;
  ushort uVar28;
  int iVar29;
  long lVar30;
  char *pcVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  long grp_id;
  int local_600;
  int _index [7];
  ulong local_560;
  Integer _hi [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer width [7];
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer plo_loc [7];
  char err_string [256];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer phi_loc [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer plo_rem [7];
  Integer dims [7];
  Integer lmask [7];
  Integer mask [7];
  
  proc = pnga_nodeid();
  iVar9 = _ga_sync_end;
  iVar4 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  lVar11 = pnga_has_ghosts(g_a);
  if (lVar11 != 0) {
    lVar1 = g_a + 1000;
    iVar3 = GA[lVar1].p_handle;
    grp_id = (long)iVar3;
    if (iVar4 != 0) {
      pnga_pgroup_sync(grp_id);
    }
    iVar4 = GA[lVar1].elemsize;
    lVar30 = (long)GA[lVar1].ndim;
    lVar19 = 0;
    lVar27 = 0;
    if (0 < lVar30) {
      lVar27 = lVar30;
    }
    for (; lVar27 != lVar19; lVar19 = lVar19 + 1) {
      width[lVar19] = GA[g_a + 1000].width[lVar19];
      dims[lVar19] = GA[g_a + 1000].dims[lVar19];
    }
    lVar19 = 0;
    for (lVar20 = 0; lVar20 != lVar27; lVar20 = lVar20 + 1) {
      uVar5 = GA[lVar1].nblock[lVar20];
      uVar37 = 0;
      if (0 < (int)uVar5) {
        uVar37 = (ulong)uVar5;
      }
      for (local_560 = 0; uVar37 != local_560; local_560 = local_560 + 1) {
        if ((long)local_560 < (long)(int)uVar5 + -1) {
          if ((GA[lVar1].mapc[lVar19 + local_560 + 1] - GA[lVar1].mapc[lVar19 + local_560]) + 1 <
              width[lVar20]) {
            return 0;
          }
        }
        else if ((GA[lVar1].dims[lVar20] - GA[lVar1].mapc[lVar19 + local_560]) + 1 < width[lVar20])
        {
          return 0;
        }
      }
      lVar19 = lVar19 + uVar37;
    }
    sVar26 = GAnproc * 0x70 | 8;
    map = (Integer *)malloc(sVar26);
    if (map == (Integer *)0x0) {
      pnga_error("pnga_update_ghost_dir:malloc failed (_ga_map)",0);
      sVar26 = GAnproc * 0x70 | 8;
    }
    proclist = (ulong *)malloc(sVar26);
    if (proclist == (ulong *)0x0) {
      pnga_error("pnga_update_ghost_dir:malloc failed (_ga_proclist)",0);
    }
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    lVar30 = lVar30 + -1;
    lVar19 = 0;
    if (0 < lVar30) {
      lVar19 = lVar30;
    }
    lVar20 = 1;
    lVar16 = lVar19;
    if (pflag != 0) {
      while (lVar16 != 0) {
        lVar20 = lVar20 * 3;
        lVar16 = lVar16 + -1;
      }
    }
    local_600 = (int)proc;
    for (lVar16 = 0; lVar16 != lVar20; lVar16 = lVar16 + 1) {
      if (pflag == 0) {
        for (lVar12 = 0; lVar19 != lVar12; lVar12 = lVar12 + 1) {
          lmask[lVar12] = 0;
        }
      }
      else {
        lVar12 = lVar16;
        for (lVar17 = 0; lVar19 != lVar17; lVar17 = lVar17 + 1) {
          lmask[lVar17] = lVar12 % 3 + -1;
          lVar12 = lVar12 / 3;
        }
      }
      lVar12 = 0;
      for (lVar17 = 0; lVar27 != lVar17; lVar17 = lVar17 + 1) {
        IVar13 = pdir;
        if (pdim + -1 != lVar17) {
          pIVar2 = lmask + lVar12;
          lVar12 = lVar12 + 1;
          IVar13 = *pIVar2;
        }
        mask[lVar17] = IVar13;
      }
      for (lVar12 = 0; lVar27 != lVar12; lVar12 = lVar12 + 1) {
        lVar17 = mask[lVar12];
        if (lVar17 == -1) {
          lVar17 = lo_loc[lVar12];
          if (1 < lVar17) {
            tlo_rem[lVar12] = lVar17 - width[lVar12];
            lVar17 = lVar17 + -1;
            goto LAB_0017f2ca;
          }
          thi_rem[lVar12] = dims[lVar12];
          tlo_rem[lVar12] = (dims[lVar12] - width[lVar12]) + 1;
        }
        else {
          if (lVar17 == 1) {
            lVar17 = hi_loc[lVar12];
            if (lVar17 < dims[lVar12]) {
              tlo_rem[lVar12] = lVar17 + 1;
              lVar17 = lVar17 + width[lVar12];
            }
            else {
              tlo_rem[lVar12] = 1;
              lVar17 = width[lVar12];
            }
          }
          else {
            if (lVar17 != 0) {
              fwrite("Illegal mask value found\n",0x19,1,_stderr);
              goto LAB_0017f2d2;
            }
            tlo_rem[lVar12] = lo_loc[lVar12];
            lVar17 = hi_loc[lVar12];
          }
LAB_0017f2ca:
          thi_rem[lVar12] = lVar17;
        }
LAB_0017f2d2:
      }
      lVar11 = pnga_locate_region(g_a,tlo_rem,thi_rem,map,(Integer *)proclist,(Integer *)&local_560)
      ;
      if (lVar11 == 0) {
        builtin_strncpy(err_string,"cannot locate region: ",0x17);
        strcpy(err_string + 0x16,GA[lVar1].name);
        sVar26 = strlen(err_string);
        sprintf(err_string + (int)sVar26," [%ld:%ld ",tlo_rem[0],thi_rem[0]);
        sVar26 = strlen(err_string);
        lVar12 = 1;
        while( true ) {
          IVar13 = pnga_ndim(g_a);
          pcVar31 = err_string + (int)sVar26;
          if (IVar13 <= lVar12) break;
          sprintf(pcVar31,",%ld:%ld ",tlo_rem[lVar12],thi_rem[lVar12]);
          sVar26 = strlen(err_string);
          lVar12 = lVar12 + 1;
        }
        pcVar31[0] = ']';
        pcVar31[1] = '\0';
        pnga_error(err_string,g_a);
      }
      if (1 < (long)local_560) {
        fwrite("More than one remote processor found\n",0x25,1,_stderr);
      }
      uVar37 = *proclist;
      pnga_distribution(g_a,uVar37,tlo_rem,thi_rem);
      for (lVar12 = 0; lVar27 != lVar12; lVar12 = lVar12 + 1) {
        lVar17 = mask[lVar12];
        if (lVar17 == -1) {
          plo_loc[lVar12] = 0;
          phi_loc[lVar12] = width[lVar12] + -1;
          lVar17 = (thi_rem[lVar12] - tlo_rem[lVar12]) + 1;
LAB_0017f4f6:
          plo_rem[lVar12] = lVar17;
        }
        else {
          if (lVar17 == 1) {
            lVar17 = width[lVar12];
            plo_loc[lVar12] = lVar17 + (hi_loc[lVar12] - lo_loc[lVar12]) + 1;
            lVar21 = (hi_loc[lVar12] - lo_loc[lVar12]) + lVar17 * 2;
LAB_0017f4bd:
            phi_loc[lVar12] = lVar21;
            goto LAB_0017f4f6;
          }
          if (lVar17 == 0) {
            lVar17 = width[lVar12];
            plo_loc[lVar12] = lVar17;
            lVar21 = (hi_loc[lVar12] + lVar17) - lo_loc[lVar12];
            goto LAB_0017f4bd;
          }
        }
      }
      uVar28 = GA[lVar1].ndim;
      lVar12 = (long)(short)uVar28;
      iVar33 = GA[lVar1].distr_type;
      if (iVar33 - 1U < 3) {
        lVar21 = (long)local_600 % GA[lVar1].num_blocks[0];
        _index[0] = (int)lVar21;
        IVar13 = proc;
        lVar17 = 0;
        while (lVar17 + 1 < lVar12) {
          IVar13 = (long)((int)IVar13 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar17];
          lVar21 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar17 + 1];
          _index[lVar17 + 1] = (int)lVar21;
          lVar17 = lVar17 + 1;
        }
        uVar10 = 0;
        if (0 < (short)uVar28) {
          uVar10 = uVar28;
        }
        for (lVar17 = 0; (ulong)uVar10 * 4 != lVar17; lVar17 = lVar17 + 4) {
          iVar32 = *(int *)((long)_index + lVar17);
          lVar21 = *(long *)((long)GA[g_a + 1000].block_dims + lVar17 * 2);
          *(long *)(err_string + lVar17 * 2) = lVar21 * iVar32 + 1;
          lVar21 = ((long)iVar32 + 1) * lVar21;
          lVar18 = *(long *)((long)GA[g_a + 1000].dims + lVar17 * 2);
          if (lVar18 <= lVar21) {
            lVar21 = lVar18;
          }
          *(long *)((long)_hi + lVar17 * 2) = lVar21;
        }
      }
      else if (iVar33 == 4) {
        lVar21 = (long)local_600 % GA[lVar1].num_blocks[0];
        _index[0] = (int)lVar21;
        IVar13 = proc;
        lVar17 = 0;
        while (lVar17 + 1 < lVar12) {
          IVar13 = (long)((int)IVar13 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar17];
          lVar21 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar17 + 1];
          _index[lVar17 + 1] = (int)lVar21;
          lVar17 = lVar17 + 1;
        }
        lVar17 = 0;
        uVar10 = 0;
        if (0 < (short)uVar28) {
          uVar10 = uVar28;
        }
        iVar32 = 0;
        for (; (ulong)uVar10 * 4 != lVar17; lVar17 = lVar17 + 4) {
          pCVar7 = GA[lVar1].mapc;
          iVar29 = *(int *)((long)_index + lVar17);
          lVar18 = (long)iVar32 + (long)iVar29;
          *(C_Integer *)(err_string + lVar17 * 2) = pCVar7[lVar18];
          lVar21 = *(long *)((long)GA[lVar1].num_blocks + lVar17 * 2);
          if ((long)iVar29 < lVar21 + -1) {
            lVar18 = pCVar7[lVar18 + 1] + -1;
          }
          else {
            lVar18 = *(long *)((long)GA[lVar1].dims + lVar17 * 2);
          }
          *(long *)((long)_hi + lVar17 * 2) = lVar18;
          iVar32 = iVar32 + (int)lVar21;
        }
      }
      else if (iVar33 == 0) {
        if (GA[lVar1].num_rstrctd == 0) {
          lVar17 = 0;
          if (0 < lVar12) {
            lVar17 = lVar12;
          }
          lVar21 = 1;
          for (lVar18 = 0; lVar17 != lVar18; lVar18 = lVar18 + 1) {
            lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar18];
          }
          if ((proc < 0) || (lVar21 <= proc)) {
            for (lVar21 = 0; lVar17 != lVar21; lVar21 = lVar21 + 1) {
              hi_loc[lVar21 + -0x20] = 0;
              _hi[lVar21] = -1;
            }
          }
          else {
            lVar21 = 0;
            IVar13 = proc;
            for (lVar18 = 0; lVar17 != lVar18; lVar18 = lVar18 + 1) {
              lVar22 = (long)GA[g_a + 1000].nblock[lVar18];
              lVar14 = IVar13 % lVar22;
              pCVar7 = GA[lVar1].mapc;
              hi_loc[lVar18 + -0x20] = pCVar7[lVar14 + lVar21];
              if (lVar14 == lVar22 + -1) {
                CVar25 = GA[g_a + 1000].dims[lVar18];
              }
              else {
                CVar25 = pCVar7[lVar14 + lVar21 + 1] + -1;
              }
              lVar21 = lVar21 + lVar22;
              _hi[lVar18] = CVar25;
              IVar13 = IVar13 / lVar22;
            }
          }
        }
        else if (proc < GA[lVar1].num_rstrctd) {
          lVar17 = 0;
          if (0 < lVar12) {
            lVar17 = lVar12;
          }
          lVar21 = 1;
          for (lVar18 = 0; lVar17 != lVar18; lVar18 = lVar18 + 1) {
            lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar18];
          }
          if ((proc < 0) || (lVar21 <= proc)) {
            for (lVar21 = 0; lVar17 != lVar21; lVar21 = lVar21 + 1) {
              hi_loc[lVar21 + -0x20] = 0;
              _hi[lVar21] = -1;
            }
          }
          else {
            lVar18 = 0;
            IVar13 = proc;
            for (lVar21 = 0; lVar17 != lVar21; lVar21 = lVar21 + 1) {
              lVar22 = (long)GA[g_a + 1000].nblock[lVar21];
              lVar14 = IVar13 % lVar22;
              pCVar7 = GA[lVar1].mapc;
              hi_loc[lVar21 + -0x20] = pCVar7[lVar14 + lVar18];
              if (lVar14 == lVar22 + -1) {
                CVar25 = GA[g_a + 1000].dims[lVar21];
              }
              else {
                CVar25 = pCVar7[lVar14 + lVar18 + 1] + -1;
              }
              lVar18 = lVar18 + lVar22;
              _hi[lVar21] = CVar25;
              IVar13 = IVar13 / lVar22;
            }
          }
        }
        else {
          iVar32 = 0;
          if (0 < (short)uVar28) {
            iVar32 = (int)(short)uVar28;
          }
          for (lVar17 = 0; iVar32 != lVar17; lVar17 = lVar17 + 1) {
            hi_loc[lVar17 + -0x20] = 0;
            _hi[lVar17] = -1;
          }
        }
      }
      lVar17 = lVar12 + -1;
      if (lVar17 == 0) {
        ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
      }
      lVar21 = 0;
      if (0 < lVar17) {
        lVar21 = lVar17;
      }
      lVar14 = 0;
      lVar18 = 1;
      for (lVar22 = 0; lVar21 != lVar22; lVar22 = lVar22 + 1) {
        lVar14 = lVar14 + plo_loc[lVar22] * lVar18;
        lVar34 = (_hi[lVar22] - hi_loc[lVar22 + -0x20]) + GA[g_a + 1000].width[lVar22] * 2 + 1;
        ld_loc[lVar22] = lVar34;
        lVar18 = lVar18 * lVar34;
      }
      lVar22 = *(long *)(stride_loc + lVar12 * 2 + 6);
      ppcVar6 = GA[lVar1].ptr;
      iVar32 = GA[lVar1].elemsize;
      pcVar31 = ppcVar6[proc];
      if (iVar33 - 1U < 3) {
        lVar23 = (long)(int)uVar37 % GA[lVar1].num_blocks[0];
        _index[0] = (int)lVar23;
        uVar15 = uVar37;
        lVar34 = 0;
        while (lVar34 + 1 < lVar12) {
          uVar15 = (long)((int)uVar15 - (int)lVar23) / GA[g_a + 1000].num_blocks[lVar34];
          lVar23 = (long)(int)uVar15 % GA[g_a + 1000].num_blocks[lVar34 + 1];
          _index[lVar34 + 1] = (int)lVar23;
          lVar34 = lVar34 + 1;
        }
        uVar10 = 0;
        if (0 < (short)uVar28) {
          uVar10 = uVar28;
        }
        for (lVar34 = 0; (ulong)uVar10 * 4 != lVar34; lVar34 = lVar34 + 4) {
          iVar33 = *(int *)((long)_index + lVar34);
          lVar23 = *(long *)((long)GA[g_a + 1000].block_dims + lVar34 * 2);
          *(long *)(err_string + lVar34 * 2) = lVar23 * iVar33 + 1;
          lVar23 = ((long)iVar33 + 1) * lVar23;
          lVar36 = *(long *)((long)GA[g_a + 1000].dims + lVar34 * 2);
          if (lVar36 <= lVar23) {
            lVar23 = lVar36;
          }
          *(long *)((long)_hi + lVar34 * 2) = lVar23;
        }
      }
      else if (iVar33 == 4) {
        lVar23 = (long)(int)uVar37 % GA[lVar1].num_blocks[0];
        _index[0] = (int)lVar23;
        uVar15 = uVar37;
        lVar34 = 0;
        while (lVar34 + 1 < lVar12) {
          uVar15 = (long)((int)uVar15 - (int)lVar23) / GA[g_a + 1000].num_blocks[lVar34];
          lVar23 = (long)(int)uVar15 % GA[g_a + 1000].num_blocks[lVar34 + 1];
          _index[lVar34 + 1] = (int)lVar23;
          lVar34 = lVar34 + 1;
        }
        lVar34 = 0;
        if ((short)uVar28 < 1) {
          uVar28 = 0;
        }
        iVar33 = 0;
        for (; (ulong)uVar28 * 4 != lVar34; lVar34 = lVar34 + 4) {
          pCVar7 = GA[lVar1].mapc;
          iVar29 = *(int *)((long)_index + lVar34);
          lVar36 = (long)iVar33 + (long)iVar29;
          *(C_Integer *)(err_string + lVar34 * 2) = pCVar7[lVar36];
          lVar23 = *(long *)((long)GA[lVar1].num_blocks + lVar34 * 2);
          if ((long)iVar29 < lVar23 + -1) {
            lVar36 = pCVar7[lVar36 + 1] + -1;
          }
          else {
            lVar36 = *(long *)((long)GA[lVar1].dims + lVar34 * 2);
          }
          *(long *)((long)_hi + lVar34 * 2) = lVar36;
          iVar33 = iVar33 + (int)lVar23;
        }
      }
      else if (iVar33 == 0) {
        if (GA[lVar1].num_rstrctd == 0) {
          lVar34 = lVar12;
          if (lVar12 < 1) {
            lVar34 = 0;
          }
          lVar23 = 1;
          for (lVar36 = 0; lVar34 != lVar36; lVar36 = lVar36 + 1) {
            lVar23 = lVar23 * GA[g_a + 1000].nblock[lVar36];
          }
          if (((long)uVar37 < 0) || (lVar23 <= (long)uVar37)) {
            for (lVar23 = 0; lVar34 != lVar23; lVar23 = lVar23 + 1) {
              hi_loc[lVar23 + -0x20] = 0;
              _hi[lVar23] = -1;
            }
          }
          else {
            lVar36 = 0;
            uVar15 = uVar37;
            for (lVar23 = 0; lVar34 != lVar23; lVar23 = lVar23 + 1) {
              lVar35 = (long)GA[g_a + 1000].nblock[lVar23];
              lVar24 = (long)uVar15 % lVar35;
              pCVar7 = GA[lVar1].mapc;
              hi_loc[lVar23 + -0x20] = pCVar7[lVar24 + lVar36];
              if (lVar24 == lVar35 + -1) {
                CVar25 = GA[g_a + 1000].dims[lVar23];
              }
              else {
                CVar25 = pCVar7[lVar24 + lVar36 + 1] + -1;
              }
              lVar36 = lVar36 + lVar35;
              _hi[lVar23] = CVar25;
              uVar15 = (long)uVar15 / lVar35;
            }
          }
        }
        else if ((long)uVar37 < GA[lVar1].num_rstrctd) {
          lVar34 = lVar12;
          if (lVar12 < 1) {
            lVar34 = 0;
          }
          lVar23 = 1;
          for (lVar36 = 0; lVar34 != lVar36; lVar36 = lVar36 + 1) {
            lVar23 = lVar23 * GA[g_a + 1000].nblock[lVar36];
          }
          if (((long)uVar37 < 0) || (lVar23 <= (long)uVar37)) {
            for (lVar23 = 0; lVar34 != lVar23; lVar23 = lVar23 + 1) {
              hi_loc[lVar23 + -0x20] = 0;
              _hi[lVar23] = -1;
            }
          }
          else {
            lVar36 = 0;
            uVar15 = uVar37;
            for (lVar23 = 0; lVar34 != lVar23; lVar23 = lVar23 + 1) {
              lVar35 = (long)GA[g_a + 1000].nblock[lVar23];
              lVar24 = (long)uVar15 % lVar35;
              pCVar7 = GA[lVar1].mapc;
              hi_loc[lVar23 + -0x20] = pCVar7[lVar24 + lVar36];
              if (lVar24 == lVar35 + -1) {
                CVar25 = GA[g_a + 1000].dims[lVar23];
              }
              else {
                CVar25 = pCVar7[lVar24 + lVar36 + 1] + -1;
              }
              lVar36 = lVar36 + lVar35;
              _hi[lVar23] = CVar25;
              uVar15 = (long)uVar15 / lVar35;
            }
          }
        }
        else {
          iVar33 = 0;
          if (0 < (short)uVar28) {
            iVar33 = (int)(short)uVar28;
          }
          for (lVar34 = 0; iVar33 != lVar34; lVar34 = lVar34 + 1) {
            hi_loc[lVar34 + -0x20] = 0;
            _hi[lVar34] = -1;
          }
        }
      }
      if (lVar17 == 0) {
        ld_rem[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
      }
      lVar17 = 1;
      lVar34 = 0;
      for (lVar23 = 0; lVar21 != lVar23; lVar23 = lVar23 + 1) {
        lVar34 = lVar34 + plo_rem[lVar23] * lVar17;
        lVar36 = (_hi[lVar23] - hi_loc[lVar23 + -0x20]) + GA[g_a + 1000].width[lVar23] * 2 + 1;
        ld_rem[lVar23] = lVar36;
        lVar17 = lVar17 * lVar36;
      }
      lVar12 = plo_rem[lVar12 + -1];
      pcVar8 = ppcVar6[uVar37];
      stride_loc[0] = iVar4;
      stride_rem[0] = iVar4;
      iVar33 = iVar4;
      iVar29 = iVar4;
      for (lVar21 = 0; lVar19 * 4 != lVar21; lVar21 = lVar21 + 4) {
        iVar33 = iVar33 * *(int *)((long)ld_rem + lVar21 * 2);
        *(int *)((long)stride_rem + lVar21) = iVar33;
        iVar29 = iVar29 * *(int *)((long)ld_loc + lVar21 * 2);
        *(int *)((long)stride_loc + lVar21) = iVar29;
        *(int *)((long)stride_rem + lVar21 + 4) = iVar33;
        *(int *)((long)stride_loc + lVar21 + 4) = iVar29;
      }
      for (lVar21 = 0; lVar27 != lVar21; lVar21 = lVar21 + 1) {
        count[lVar21] = ((int)phi_loc[lVar21] - (int)plo_loc[lVar21]) + 1;
      }
      count[0] = count[0] * iVar4;
      if (-1 < iVar3) {
        uVar37 = (ulong)(uint)PGRP_LIST[grp_id].inv_map_proc_list[uVar37];
      }
      ARMCI_GetS(pcVar8 + (lVar17 * lVar12 + lVar34) * (long)iVar32,stride_rem,
                 pcVar31 + (lVar18 * lVar22 + lVar14) * (long)iVar32,stride_loc,count,(int)lVar30,
                 (int)uVar37);
    }
    if (iVar9 != 0) {
      pnga_pgroup_sync(grp_id);
    }
    free(map);
    free(proclist);
  }
  return 1;
}

Assistant:

logical pnga_update_ghost_dir(Integer g_a,    /* GA handle */
                                   Integer pdim,   /* Dimension of update */
                                   Integer pdir,   /* Direction of update (+/-1) */
                                   logical pflag)  /* include corner cells */
{
  Integer idx, ipx, inx, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer ntot, mask[MAXDIM],lmask[MAXDIM];
  Integer size, ndim, i, itmp, idim, idir;
  Integer width[MAXDIM], dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM], phi_loc[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer plo_rem[MAXDIM]/*, phi_rem[MAXDIM]*/;
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  logical flag;
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) 
    return TRUE;
  
  p_handle = GA[handle].p_handle;
  if(local_sync_begin)pnga_pgroup_sync(p_handle);
  idim = pdim;
  idir = pdir;
  flag = pflag;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  /* initialize ghost cell widths and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater than
     the corresponding value in width[]). */
  ipx = 0;
  for (idx = 0; idx < ndim; idx++) {
    for (np = 0; np < GA[handle].nblock[idx]; np++) {
      if (np < GA[handle].nblock[idx] - 1) {
        if (GA[handle].mapc[ipx+1]-GA[handle].mapc[ipx]+1<width[idx]) {
          return FALSE;
        }
      } else {
        if (GA[handle].dims[idx]-GA[handle].mapc[ipx]+1<width[idx]) {
          return FALSE;
        }
      }
      ipx++;
    }
  }

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update_ghost_dir:malloc failed (_ga_map)",0);
  _ga_proclist = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update_ghost_dir:malloc failed (_ga_proclist)",0);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[GAme];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* evaluate total number of GET operations */
  ntot = 1;
  if (flag) {
    for (idx=0; idx < ndim-1; idx++) ntot *= 3;
  }

  /* Loop over all GET operations. */
  for (ipx=0; ipx < ntot; ipx++) {
    /* Convert ipx to corresponding mask values */
    if (flag) {
      itmp = ipx;
      for (idx = 0; idx < ndim-1; idx++) {
        i = itmp%3;
        lmask[idx] = i-1;
        itmp = (itmp-i)/3;
      }
    } else {
      for (idx = 0; idx < ndim-1; idx++) lmask[idx] = 0;
    }
    inx = 0;
    for (idx = 0; idx < ndim; idx++) {
      if (idx == idim-1) {
        mask[idx] = idir;
      } else {
        mask[idx] = lmask[inx];
        inx++;
      }
    }
    /* Now that mask has been determined, find processor that contains
     * data needed by the corresponding block of ghost cells */
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        tlo_rem[idx] = lo_loc[idx];
        thi_rem[idx] = hi_loc[idx];
      } else if (mask[idx] == -1) {
        if (lo_loc[idx] > 1) {
          tlo_rem[idx] = lo_loc[idx]-width[idx];
          thi_rem[idx] = lo_loc[idx]-1;
        } else {
          tlo_rem[idx] = dims[idx]-width[idx]+1;
          thi_rem[idx] = dims[idx];
        }
      } else if (mask[idx] == 1) {
        if (hi_loc[idx] < dims[idx]) {
          tlo_rem[idx] = hi_loc[idx] + 1;
          thi_rem[idx] = hi_loc[idx] + width[idx];
        } else {
          tlo_rem[idx] = 1;
          thi_rem[idx] = width[idx];
        }
      } else {
        fprintf(stderr,"Illegal mask value found\n");
      }
    }
    /* Locate remote processor to which data must be sent */
    if (!pnga_locate_region(g_a, tlo_rem, thi_rem, _ga_map,
       _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
       tlo_rem, thi_rem, g_a);
    if (np > 1) {
      fprintf(stderr,"More than one remote processor found\n");
    }
    /* Remote processor has been identified, now get ready to get
       data from it. Start by getting distribution on remote
       processor.*/
    proc_rem = _ga_proclist[0];
    pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = plo_loc[idx];
        /*phi_rem[idx] = phi_loc[idx];*/
      } else if (mask[idx] == -1) {
        plo_loc[idx] = 0;
        phi_loc[idx] = width[idx]-1;
        plo_rem[idx] = thi_rem[idx]-tlo_rem[idx]+1;
        /*phi_rem[idx] = thi_rem[idx]-tlo_rem[idx]+width[idx];*/
      } else if (mask[idx] == 1) {
        plo_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx]+1;
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+2*width[idx];
        plo_rem[idx] = width[idx];
        /*phi_rem[idx] = 2*width[idx]-1;*/
      }
    }
    /* Get pointer to local data buffer and remote data
       buffer as well as lists of leading dimenstions */
    gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
    gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

    /* Evaluate strides on local and remote processors */
    gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
                  stride_loc);

    /* Compute the number of elements in each dimension and store
       result in count. Scale the first element in count by the
       element size. */
    gam_ComputeCount(ndim, plo_loc, phi_loc, count);
    count[0] *= size;
 
    /* get data from remote processor */
    if (p_handle >= 0) {
      proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
    }
    ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
          (int)(ndim - 1), (int)proc_rem);
  }

  if(local_sync_end)pnga_pgroup_sync(p_handle);
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}